

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_protochain(compiler_state_t *cstate,int v,int proto,int dir)

{
  int iVar1;
  int n;
  int iVar2;
  int iVar3;
  int iVar4;
  block *b0_00;
  slist *psVar5;
  int local_390;
  int j;
  int v6advance;
  int v6end;
  int v6start;
  int reg2;
  int max;
  int i;
  int end;
  int again;
  int ahcheck;
  int fix5;
  int fix4;
  int fix3;
  int fix2;
  slist *s [100];
  block *b;
  block *b0;
  int dir_local;
  int proto_local;
  int v_local;
  compiler_state_t *cstate_local;
  
  n = alloc_reg(cstate);
  memset(&fix3,0,800);
  fix5 = 0;
  if (proto == 0) {
    b0_00 = gen_protochain(cstate,v,2,dir);
    s[99] = (slist *)gen_protochain(cstate,v,0x11,dir);
    gen_or(b0_00,(block *)s[99]);
  }
  else {
    if ((proto != 2) && (proto != 0x11)) {
      bpf_error(cstate,"bad protocol applied for \'protochain\'");
    }
    if ((cstate->off_linkpl).is_variable != 0) {
      bpf_error(cstate,"\'protochain\' not supported with variable length headers");
    }
    cstate->no_optimize = 1;
    _fix3 = new_stmt(cstate,0);
    reg2 = 1;
    if (proto == 2) {
      b = gen_linktype(cstate,0x800);
      s[0] = new_stmt(cstate,0x30);
      (s[0]->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + 9;
      s[1] = new_stmt(cstate,0xb1);
      (s[1]->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl;
      reg2 = 3;
    }
    else if (proto == 0x11) {
      b = gen_linktype(cstate,0x86dd);
      s[0] = new_stmt(cstate,0x30);
      (s[0]->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + 6;
      s[1] = new_stmt(cstate,1);
      (s[1]->s).k = 0x28;
      reg2 = 3;
    }
    else {
      bpf_error(cstate,"unsupported proto to gen_protochain");
    }
    iVar1 = reg2;
    psVar5 = new_stmt(cstate,0x15);
    *(slist **)(&fix3 + (long)reg2 * 2) = psVar5;
    *(int *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x18) = v;
    *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 8) = 0;
    *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x10) = 0;
    iVar2 = reg2 + 1;
    psVar5 = new_stmt(cstate,0x15);
    *(slist **)(&fix3 + (long)iVar2 * 2) = psVar5;
    *(undefined8 *)(*(long *)(&fix3 + (long)iVar2 * 2) + 8) = 0;
    *(undefined8 *)(*(long *)(&fix3 + (long)iVar2 * 2) + 0x10) = 0;
    *(undefined4 *)(*(long *)(&fix3 + (long)iVar2 * 2) + 0x18) = 0x3b;
    *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x10) =
         *(undefined8 *)(&fix3 + (long)iVar2 * 2);
    local_390 = reg2 + 2;
    if (proto == 0x11) {
      psVar5 = new_stmt(cstate,0x15);
      *(slist **)(&fix3 + (long)local_390 * 2) = psVar5;
      *(undefined8 *)(*(long *)(&fix3 + (long)local_390 * 2) + 8) = 0;
      *(undefined8 *)(*(long *)(&fix3 + (long)local_390 * 2) + 0x10) = 0;
      *(undefined4 *)(*(long *)(&fix3 + (long)local_390 * 2) + 0x18) = 0;
      *(undefined8 *)(*(long *)(&fix3 + (long)iVar2 * 2) + 0x10) =
           *(undefined8 *)(&fix3 + (long)local_390 * 2);
      iVar3 = reg2 + 3;
      psVar5 = new_stmt(cstate,0x15);
      *(slist **)(&fix3 + (long)iVar3 * 2) = psVar5;
      *(slist **)(*(long *)(&fix3 + (long)(reg2 + 2) * 2) + 0x10) = psVar5;
      *(undefined8 *)(*(long *)(&fix3 + (long)iVar3 * 2) + 8) = 0;
      *(undefined8 *)(*(long *)(&fix3 + (long)iVar3 * 2) + 0x10) = 0;
      *(undefined4 *)(*(long *)(&fix3 + (long)iVar3 * 2) + 0x18) = 0x3c;
      iVar3 = reg2 + 4;
      psVar5 = new_stmt(cstate,0x15);
      *(slist **)(&fix3 + (long)iVar3 * 2) = psVar5;
      *(slist **)(*(long *)(&fix3 + (long)(reg2 + 3) * 2) + 0x10) = psVar5;
      *(undefined8 *)(*(long *)(&fix3 + (long)iVar3 * 2) + 8) = 0;
      *(undefined8 *)(*(long *)(&fix3 + (long)iVar3 * 2) + 0x10) = 0;
      *(undefined4 *)(*(long *)(&fix3 + (long)iVar3 * 2) + 0x18) = 0x2b;
      fix5 = reg2 + 5;
      psVar5 = new_stmt(cstate,0x15);
      *(slist **)(&fix3 + (long)fix5 * 2) = psVar5;
      *(slist **)(*(long *)(&fix3 + (long)(reg2 + 4) * 2) + 0x10) = psVar5;
      *(undefined8 *)(*(long *)(&fix3 + (long)fix5 * 2) + 8) = 0;
      *(undefined8 *)(*(long *)(&fix3 + (long)fix5 * 2) + 0x10) = 0;
      *(undefined4 *)(*(long *)(&fix3 + (long)fix5 * 2) + 0x18) = 0x2c;
      iVar3 = reg2 + 6;
      psVar5 = new_stmt(cstate,0x50);
      *(slist **)(&fix3 + (long)iVar3 * 2) = psVar5;
      *(u_int *)(*(long *)(&fix3 + (long)iVar3 * 2) + 0x18) =
           (cstate->off_linkpl).constant_part + cstate->off_nl;
      psVar5 = new_stmt(cstate,2);
      *(slist **)(&fix3 + (long)(reg2 + 7) * 2) = psVar5;
      *(int *)(*(long *)(&fix3 + (long)(reg2 + 7) * 2) + 0x18) = n;
      psVar5 = new_stmt(cstate,0x50);
      *(slist **)(&fix3 + (long)(reg2 + 8) * 2) = psVar5;
      *(u_int *)(*(long *)(&fix3 + (long)(reg2 + 8) * 2) + 0x18) =
           (cstate->off_linkpl).constant_part + cstate->off_nl + 1;
      psVar5 = new_stmt(cstate,4);
      *(slist **)(&fix3 + (long)(reg2 + 9) * 2) = psVar5;
      *(undefined4 *)(*(long *)(&fix3 + (long)(reg2 + 9) * 2) + 0x18) = 1;
      psVar5 = new_stmt(cstate,0x24);
      *(slist **)(&fix3 + (long)(reg2 + 10) * 2) = psVar5;
      *(undefined4 *)(*(long *)(&fix3 + (long)(reg2 + 10) * 2) + 0x18) = 8;
      psVar5 = new_stmt(cstate,0xc);
      *(slist **)(&fix3 + (long)(reg2 + 0xb) * 2) = psVar5;
      *(undefined4 *)(*(long *)(&fix3 + (long)(reg2 + 0xb) * 2) + 0x18) = 0;
      psVar5 = new_stmt(cstate,7);
      *(slist **)(&fix3 + (long)(reg2 + 0xc) * 2) = psVar5;
      psVar5 = new_stmt(cstate,0x60);
      *(slist **)(&fix3 + (long)(reg2 + 0xd) * 2) = psVar5;
      *(int *)(*(long *)(&fix3 + (long)(reg2 + 0xd) * 2) + 0x18) = n;
      iVar4 = reg2 + 0xe;
      psVar5 = new_stmt(cstate,5);
      *(slist **)(&fix3 + (long)iVar4 * 2) = psVar5;
      *(int *)(*(long *)(&fix3 + (long)iVar4 * 2) + 0x18) = (reg2 - iVar4) + -1;
      *(undefined8 *)(*(long *)(&fix3 + (long)(reg2 + 0xd) * 2) + 0x10) =
           *(undefined8 *)(&fix3 + (long)iVar4 * 2);
      reg2 = reg2 + 0xf;
      for (; local_390 <= fix5; local_390 = local_390 + 1) {
        *(undefined8 *)(*(long *)(&fix3 + (long)local_390 * 2) + 8) =
             *(undefined8 *)(&fix3 + (long)iVar3 * 2);
      }
    }
    else {
      psVar5 = new_stmt(cstate,4);
      *(slist **)(&fix3 + (long)local_390 * 2) = psVar5;
      *(undefined4 *)(*(long *)(&fix3 + (long)local_390 * 2) + 0x18) = 0;
      *(undefined8 *)(*(long *)(&fix3 + (long)iVar2 * 2) + 0x10) =
           *(undefined8 *)(&fix3 + (long)local_390 * 2);
      reg2 = reg2 + 3;
    }
    iVar3 = reg2;
    psVar5 = new_stmt(cstate,0x15);
    *(slist **)(&fix3 + (long)reg2 * 2) = psVar5;
    *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 8) = 0;
    *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x10) = 0;
    *(undefined4 *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x18) = 0x33;
    if (fix5 != 0) {
      *(undefined8 *)(*(long *)(&fix3 + (long)fix5 * 2) + 0x10) =
           *(undefined8 *)(&fix3 + (long)reg2 * 2);
    }
    psVar5 = new_stmt(cstate,0x87);
    *(slist **)(&fix3 + (long)(reg2 + 1) * 2) = psVar5;
    *(slist **)(*(long *)(&fix3 + (long)reg2 * 2) + 8) = psVar5;
    psVar5 = new_stmt(cstate,0x50);
    *(slist **)(&fix3 + (long)(reg2 + 2) * 2) = psVar5;
    *(u_int *)(*(long *)(&fix3 + (long)(reg2 + 2) * 2) + 0x18) =
         (cstate->off_linkpl).constant_part + cstate->off_nl;
    psVar5 = new_stmt(cstate,2);
    *(slist **)(&fix3 + (long)(reg2 + 3) * 2) = psVar5;
    *(int *)(*(long *)(&fix3 + (long)(reg2 + 3) * 2) + 0x18) = n;
    psVar5 = new_stmt(cstate,0x87);
    *(slist **)(&fix3 + (long)(reg2 + 4) * 2) = psVar5;
    *(slist **)(*(long *)(&fix3 + (long)(reg2 + 3) * 2) + 8) = psVar5;
    psVar5 = new_stmt(cstate,4);
    *(slist **)(&fix3 + (long)(reg2 + 5) * 2) = psVar5;
    *(undefined4 *)(*(long *)(&fix3 + (long)(reg2 + 5) * 2) + 0x18) = 1;
    psVar5 = new_stmt(cstate,7);
    *(slist **)(&fix3 + (long)(reg2 + 6) * 2) = psVar5;
    psVar5 = new_stmt(cstate,0x50);
    *(slist **)(&fix3 + (long)(reg2 + 7) * 2) = psVar5;
    *(u_int *)(*(long *)(&fix3 + (long)(reg2 + 7) * 2) + 0x18) =
         (cstate->off_linkpl).constant_part + cstate->off_nl;
    psVar5 = new_stmt(cstate,4);
    *(slist **)(&fix3 + (long)(reg2 + 8) * 2) = psVar5;
    *(undefined4 *)(*(long *)(&fix3 + (long)(reg2 + 8) * 2) + 0x18) = 2;
    psVar5 = new_stmt(cstate,0x24);
    *(slist **)(&fix3 + (long)(reg2 + 9) * 2) = psVar5;
    *(undefined4 *)(*(long *)(&fix3 + (long)(reg2 + 9) * 2) + 0x18) = 4;
    psVar5 = new_stmt(cstate,7);
    *(slist **)(&fix3 + (long)(reg2 + 10) * 2) = psVar5;
    psVar5 = new_stmt(cstate,0x60);
    *(slist **)(&fix3 + (long)(reg2 + 0xb) * 2) = psVar5;
    *(int *)(*(long *)(&fix3 + (long)(reg2 + 0xb) * 2) + 0x18) = n;
    iVar4 = reg2 + 0xc;
    psVar5 = new_stmt(cstate,5);
    *(slist **)(&fix3 + (long)iVar4 * 2) = psVar5;
    *(int *)(*(long *)(&fix3 + (long)iVar4 * 2) + 0x18) = (iVar1 - iVar4) + -1;
    iVar4 = reg2 + 0xd;
    psVar5 = new_stmt(cstate,4);
    *(slist **)(&fix3 + (long)iVar4 * 2) = psVar5;
    *(undefined4 *)(*(long *)(&fix3 + (long)iVar4 * 2) + 0x18) = 0;
    *(undefined8 *)(*(long *)(&fix3 + (long)iVar2 * 2) + 8) =
         *(undefined8 *)(&fix3 + (long)iVar4 * 2);
    *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x10) =
         *(undefined8 *)(&fix3 + (long)iVar4 * 2);
    *(undefined8 *)(*(long *)(&fix3 + (long)iVar1 * 2) + 8) =
         *(undefined8 *)(&fix3 + (long)iVar4 * 2);
    for (reg2 = 0; reg2 < iVar3 + 0xd; reg2 = reg2 + 1) {
      *(undefined8 *)(*(long *)(&fix3 + (long)reg2 * 2) + 0x20) =
           *(undefined8 *)(&fix3 + (long)(reg2 + 1) * 2);
    }
    *(undefined8 *)(*(long *)(&fix3 + (long)(iVar3 + 0xd) * 2) + 0x20) = 0;
    s[99] = (slist *)new_block(cstate,0x15);
    ((block *)s[99])->stmts = s[0];
    (((block *)s[99])->s).k = v;
    free_reg(cstate,n);
    gen_and(b,(block *)s[99]);
  }
  return (block *)s[99];
}

Assistant:

static struct block *
gen_protochain(compiler_state_t *cstate, int v, int proto, int dir)
{
#ifdef NO_PROTOCHAIN
	return gen_proto(cstate, v, proto, dir);
#else
	struct block *b0, *b;
	struct slist *s[100];
	int fix2, fix3, fix4, fix5;
	int ahcheck, again, end;
	int i, max;
	int reg2 = alloc_reg(cstate);

	memset(s, 0, sizeof(s));
	fix3 = fix4 = fix5 = 0;

	switch (proto) {
	case Q_IP:
	case Q_IPV6:
		break;
	case Q_DEFAULT:
		b0 = gen_protochain(cstate, v, Q_IP, dir);
		b = gen_protochain(cstate, v, Q_IPV6, dir);
		gen_or(b0, b);
		return b;
	default:
		bpf_error(cstate, "bad protocol applied for 'protochain'");
		/*NOTREACHED*/
	}

	/*
	 * We don't handle variable-length prefixes before the link-layer
	 * header, or variable-length link-layer headers, here yet.
	 * We might want to add BPF instructions to do the protochain
	 * work, to simplify that and, on platforms that have a BPF
	 * interpreter with the new instructions, let the filtering
	 * be done in the kernel.  (We already require a modified BPF
	 * engine to do the protochain stuff, to support backward
	 * branches, and backward branch support is unlikely to appear
	 * in kernel BPF engines.)
	 */
	if (cstate->off_linkpl.is_variable)
		bpf_error(cstate, "'protochain' not supported with variable length headers");

	cstate->no_optimize = 1; /*this code is not compatible with optimzer yet */

	/*
	 * s[0] is a dummy entry to protect other BPF insn from damage
	 * by s[fix] = foo with uninitialized variable "fix".  It is somewhat
	 * hard to find interdependency made by jump table fixup.
	 */
	i = 0;
	s[i] = new_stmt(cstate, 0);	/*dummy*/
	i++;

	switch (proto) {
	case Q_IP:
		b0 = gen_linktype(cstate, ETHERTYPE_IP);

		/* A = ip->ip_p */
		s[i] = new_stmt(cstate, BPF_LD|BPF_ABS|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 9;
		i++;
		/* X = ip->ip_hl << 2 */
		s[i] = new_stmt(cstate, BPF_LDX|BPF_MSH|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		i++;
		break;

	case Q_IPV6:
		b0 = gen_linktype(cstate, ETHERTYPE_IPV6);

		/* A = ip6->ip_nxt */
		s[i] = new_stmt(cstate, BPF_LD|BPF_ABS|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 6;
		i++;
		/* X = sizeof(struct ip6_hdr) */
		s[i] = new_stmt(cstate, BPF_LDX|BPF_IMM);
		s[i]->s.k = 40;
		i++;
		break;

	default:
		bpf_error(cstate, "unsupported proto to gen_protochain");
		/*NOTREACHED*/
	}

	/* again: if (A == v) goto end; else fall through; */
	again = i;
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.k = v;
	s[i]->s.jt = NULL;		/*later*/
	s[i]->s.jf = NULL;		/*update in next stmt*/
	fix5 = i;
	i++;

#ifndef IPPROTO_NONE
#define IPPROTO_NONE	59
#endif
	/* if (A == IPPROTO_NONE) goto end */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.jt = NULL;	/*later*/
	s[i]->s.jf = NULL;	/*update in next stmt*/
	s[i]->s.k = IPPROTO_NONE;
	s[fix5]->s.jf = s[i];
	fix2 = i;
	i++;

	if (proto == Q_IPV6) {
		int v6start, v6end, v6advance, j;

		v6start = i;
		/* if (A == IPPROTO_HOPOPTS) goto v6advance */
		s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_HOPOPTS;
		s[fix2]->s.jf = s[i];
		i++;
		/* if (A == IPPROTO_DSTOPTS) goto v6advance */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_DSTOPTS;
		i++;
		/* if (A == IPPROTO_ROUTING) goto v6advance */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*update in next stmt*/
		s[i]->s.k = IPPROTO_ROUTING;
		i++;
		/* if (A == IPPROTO_FRAGMENT) goto v6advance; else goto ahcheck; */
		s[i - 1]->s.jf = s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
		s[i]->s.jt = NULL;	/*later*/
		s[i]->s.jf = NULL;	/*later*/
		s[i]->s.k = IPPROTO_FRAGMENT;
		fix3 = i;
		v6end = i;
		i++;

		/* v6advance: */
		v6advance = i;

		/*
		 * in short,
		 * A = P[X + packet head];
		 * X = X + (P[X + packet head + 1] + 1) * 8;
		 */
		/* A = P[X + packet head] */
		s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
		i++;
		/* MEM[reg2] = A */
		s[i] = new_stmt(cstate, BPF_ST);
		s[i]->s.k = reg2;
		i++;
		/* A = P[X + packet head + 1]; */
		s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
		s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl + 1;
		i++;
		/* A += 1 */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
		s[i]->s.k = 1;
		i++;
		/* A *= 8 */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_MUL|BPF_K);
		s[i]->s.k = 8;
		i++;
		/* A += X */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_X);
		s[i]->s.k = 0;
		i++;
		/* X = A; */
		s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
		i++;
		/* A = MEM[reg2] */
		s[i] = new_stmt(cstate, BPF_LD|BPF_MEM);
		s[i]->s.k = reg2;
		i++;

		/* goto again; (must use BPF_JA for backward jump) */
		s[i] = new_stmt(cstate, BPF_JMP|BPF_JA);
		s[i]->s.k = again - i - 1;
		s[i - 1]->s.jf = s[i];
		i++;

		/* fixup */
		for (j = v6start; j <= v6end; j++)
			s[j]->s.jt = s[v6advance];
	} else {
		/* nop */
		s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
		s[i]->s.k = 0;
		s[fix2]->s.jf = s[i];
		i++;
	}

	/* ahcheck: */
	ahcheck = i;
	/* if (A == IPPROTO_AH) then fall through; else goto end; */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JEQ|BPF_K);
	s[i]->s.jt = NULL;	/*later*/
	s[i]->s.jf = NULL;	/*later*/
	s[i]->s.k = IPPROTO_AH;
	if (fix3)
		s[fix3]->s.jf = s[ahcheck];
	fix4 = i;
	i++;

	/*
	 * in short,
	 * A = P[X];
	 * X = X + (P[X + 1] + 2) * 4;
	 */
	/* A = X */
	s[i - 1]->s.jt = s[i] = new_stmt(cstate, BPF_MISC|BPF_TXA);
	i++;
	/* A = P[X + packet head]; */
	s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
	s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	i++;
	/* MEM[reg2] = A */
	s[i] = new_stmt(cstate, BPF_ST);
	s[i]->s.k = reg2;
	i++;
	/* A = X */
	s[i - 1]->s.jt = s[i] = new_stmt(cstate, BPF_MISC|BPF_TXA);
	i++;
	/* A += 1 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 1;
	i++;
	/* X = A */
	s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
	i++;
	/* A = P[X + packet head] */
	s[i] = new_stmt(cstate, BPF_LD|BPF_IND|BPF_B);
	s[i]->s.k = cstate->off_linkpl.constant_part + cstate->off_nl;
	i++;
	/* A += 2 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 2;
	i++;
	/* A *= 4 */
	s[i] = new_stmt(cstate, BPF_ALU|BPF_MUL|BPF_K);
	s[i]->s.k = 4;
	i++;
	/* X = A; */
	s[i] = new_stmt(cstate, BPF_MISC|BPF_TAX);
	i++;
	/* A = MEM[reg2] */
	s[i] = new_stmt(cstate, BPF_LD|BPF_MEM);
	s[i]->s.k = reg2;
	i++;

	/* goto again; (must use BPF_JA for backward jump) */
	s[i] = new_stmt(cstate, BPF_JMP|BPF_JA);
	s[i]->s.k = again - i - 1;
	i++;

	/* end: nop */
	end = i;
	s[i] = new_stmt(cstate, BPF_ALU|BPF_ADD|BPF_K);
	s[i]->s.k = 0;
	s[fix2]->s.jt = s[end];
	s[fix4]->s.jf = s[end];
	s[fix5]->s.jt = s[end];
	i++;

	/*
	 * make slist chain
	 */
	max = i;
	for (i = 0; i < max - 1; i++)
		s[i]->next = s[i + 1];
	s[max - 1]->next = NULL;

	/*
	 * emit final check
	 */
	b = new_block(cstate, JMP(BPF_JEQ));
	b->stmts = s[1];	/*remember, s[0] is dummy*/
	b->s.k = v;

	free_reg(cstate, reg2);

	gen_and(b0, b);
	return b;
#endif
}